

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

iterator __thiscall
QHash<QNetworkReply*,QRestAccessManagerPrivate::CallerInfo>::
emplace<QRestAccessManagerPrivate::CallerInfo_const&>
          (QHash<QNetworkReply*,QRestAccessManagerPrivate::CallerInfo> *this,QNetworkReply **key,
          CallerInfo *args)

{
  Data *pDVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  piter pVar3;
  CallerInfo local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = *(Data **)this;
  if (pDVar1 == (Data *)0x0) {
    local_40.contextObject.wp.d = (Data *)0x0;
LAB_00207bd0:
    QHash<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo>::detach
              ((QHash<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo> *)this);
    pVar3 = (piter)emplace_helper<QRestAccessManagerPrivate::CallerInfo_const&>(this,key,args);
    QHash<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo>::~QHash
              ((QHash<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo> *)&local_40);
  }
  else {
    if (1 < (uint)(pDVar1->weakref)._q_value.super___atomic_base<int>._M_i) {
      local_40.contextObject.wp.d = pDVar1;
      if ((pDVar1->weakref)._q_value.super___atomic_base<int>._M_i != -1) {
        LOCK();
        (pDVar1->weakref)._q_value.super___atomic_base<int>._M_i =
             (pDVar1->weakref)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      goto LAB_00207bd0;
    }
    uVar2._0_4_ = pDVar1[1].weakref;
    uVar2._4_4_ = pDVar1[1].strongref;
    if (pDVar1->destroyer < (DestroyerFn)(uVar2 >> 1)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        pVar3 = (piter)emplace_helper<QRestAccessManagerPrivate::CallerInfo_const&>(this,key,args);
        return (iterator)pVar3;
      }
      goto LAB_00207c46;
    }
    QRestAccessManagerPrivate::CallerInfo::CallerInfo(&local_40,args);
    pVar3 = (piter)QHash<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo>::
                   emplace_helper<QRestAccessManagerPrivate::CallerInfo>
                             ((QHash<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo> *)this,
                              key,&local_40);
    QRestAccessManagerPrivate::CallerInfo::~CallerInfo(&local_40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (iterator)pVar3;
  }
LAB_00207c46:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }